

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O2

bool __thiscall
Kernel::InterpretedLiteralEvaluator::balanceDivide
          (InterpretedLiteralEvaluator *this,Interpretation multiply,Term *AoverB,TermList A,
          TermList C,TermList *result,bool *swap)

{
  bool bVar1;
  bool bVar2;
  uint fn;
  TermList TVar3;
  Term *pTVar4;
  RationalConstantType bcon;
  
  fn = Signature::getInterpretingSymbol(DAT_00a14190,multiply);
  bVar1 = false;
  TVar3 = Term::termArg(AoverB,0);
  if (TVar3._content == A._content) {
    TVar3 = Term::termArg(AoverB,1);
    pTVar4 = Term::create2(fn,C,TVar3);
    result->_content = (uint64_t)pTVar4;
    RationalConstantType::RationalConstantType(&bcon);
    bVar1 = Theory::tryInterpretConstant((Theory *)theory,TVar3,&bcon);
    if (bVar1) {
      bVar2 = RationalConstantType::isNegative(&bcon);
      if (bVar2) {
        *swap = (bool)(*swap ^ 1);
      }
    }
    RationalConstantType::~RationalConstantType(&bcon);
  }
  return bVar1;
}

Assistant:

bool InterpretedLiteralEvaluator::balanceDivide(Interpretation multiply, 
                       Term* AoverB, TermList A, TermList C, TermList& result, bool& swap)
{
#if VDEBUG
    TermList srt = theory->getOperationSort(multiply); 
    ASS(srt == AtomicSort::realSort() || srt == AtomicSort::rationalSort());
#endif

    unsigned mul = env.signature->getInterpretingSymbol(multiply);
    if(AoverB->termArg(0)!=A)return false;

    auto B = AoverB->termArg(1);

    result = TermList(Term::create2(mul,C,B));

    RationalConstantType bcon;
    if(theory->tryInterpretConstant(B,bcon)){
      ASS(!bcon.isZero());
      if(bcon.isNegative()){ swap=!swap; } // switch the polarity of an inequality if we're under one
      return true;
    }
    // Unsure exactly what the best thing to do here, so for now give up
    // This means we only balance when we have a constant on the variable side
    return false;    
}